

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O3

void __thiscall TgBot::Api::deleteMessage(Api *this,int64_t chatId,int32_t messageId)

{
  char *pcVar1;
  long lVar2;
  initializer_list<TgBot::HttpReqArg> __l;
  allocator_type local_26d;
  int32_t local_26c;
  int64_t local_268;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_> local_1e0;
  string local_1c8;
  string local_1a8;
  string local_188;
  ptree local_168;
  HttpReqArg local_140;
  HttpReqArg local_b8;
  
  local_26c = messageId;
  local_268 = chatId;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"deleteMessage","");
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_220,"chat_id","");
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"text/plain","");
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"");
  HttpReqArg::HttpReqArg<long>(&local_140,&local_220,&local_268,false,&local_240,&local_188);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_260,"message_id","");
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"text/plain","");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"");
  HttpReqArg::HttpReqArg<int>(&local_b8,&local_260,&local_26c,false,&local_1a8,&local_1c8);
  __l._M_len = 2;
  __l._M_array = &local_140;
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::vector
            (&local_1e0,__l,&local_26d);
  sendRequest(&local_168,this,&local_200,&local_1e0);
  boost::property_tree::
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~basic_ptree(&local_168);
  std::vector<TgBot::HttpReqArg,_std::allocator<TgBot::HttpReqArg>_>::~vector(&local_1e0);
  lVar2 = 0x110;
  do {
    pcVar1 = *(char **)((long)&local_168.m_data._M_string_length + lVar2);
    if (local_168.m_data.field_2._M_local_buf + lVar2 + 8 != pcVar1) {
      operator_delete(pcVar1);
    }
    pcVar1 = *(char **)((long)&local_188._M_string_length + lVar2);
    if (local_188.field_2._M_local_buf + lVar2 + 8 != pcVar1) {
      operator_delete(pcVar1);
    }
    pcVar1 = *(char **)((long)&local_1a8._M_dataplus._M_p + lVar2);
    if (local_1a8.field_2._M_local_buf + lVar2 != pcVar1) {
      operator_delete(pcVar1);
    }
    pcVar1 = *(char **)((long)&local_1c8._M_dataplus._M_p + lVar2);
    if (local_1c8.field_2._M_local_buf + lVar2 != pcVar1) {
      operator_delete(pcVar1);
    }
    lVar2 = lVar2 + -0x88;
  } while (lVar2 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Api::deleteMessage(int64_t chatId, int32_t messageId) const {
    sendRequest("deleteMessage", { HttpReqArg("chat_id", chatId), HttpReqArg("message_id", messageId) });
}